

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_warp_affine.c
# Opt level: O1

void fe_warp_affine_set_parameters(char *param_str,float sampling_rate)

{
  int iVar1;
  char *str;
  long lVar2;
  double dVar3;
  char temp_param_str [256];
  char acStack_118 [256];
  
  nyquist_frequency = sampling_rate * 0.5;
  if (param_str == (char *)0x0) {
    is_neutral = 0;
  }
  else {
    iVar1 = strcmp(param_str,p_str);
    if (iVar1 != 0) {
      is_neutral = 1;
      strcpy(acStack_118,param_str);
      params[0] = 0.0;
      params[1] = 0.0;
      strcpy(p_str,param_str);
      str = strtok(acStack_118," \t");
      if (str == (char *)0x0) {
        str = (char *)0x0;
      }
      else {
        lVar2 = 0;
        do {
          dVar3 = atof_c(str);
          *(float *)((long)params + lVar2) = (float)dVar3;
          str = strtok((char *)0x0," \t");
          if (lVar2 != 0) break;
          lVar2 = 4;
        } while (str != (char *)0x0);
      }
      if (str != (char *)0x0) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_warp_affine.c"
                ,0x82,"Affine warping takes up to two arguments, %s ignored.\n",str);
      }
      if ((params[0] == 0.0) && (!NAN(params[0]))) {
        is_neutral = 0;
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_warp_affine.c"
                ,0x87,"Affine warping cannot have slope zero, warping not applied.\n");
      }
    }
  }
  return;
}

Assistant:

void
fe_warp_affine_set_parameters(char const *param_str, float sampling_rate)
{
    char *tok;
    char *seps = " \t";
    char temp_param_str[256];
    int param_index = 0;

    nyquist_frequency = sampling_rate / 2;
    if (param_str == NULL) {
        is_neutral = YES;
        return;
    }
    /* The new parameters are the same as the current ones, so do nothing. */
    if (strcmp(param_str, p_str) == 0) {
        return;
    }
    is_neutral = NO;
    strcpy(temp_param_str, param_str);
    memset(params, 0, N_PARAM * sizeof(float));
    strcpy(p_str, param_str);
    /* FIXME: strtok() is not re-entrant... */
    tok = strtok(temp_param_str, seps);
    while (tok != NULL) {
        params[param_index++] = (float) atof_c(tok);
        tok = strtok(NULL, seps);
        if (param_index >= N_PARAM) {
            break;
        }
    }
    if (tok != NULL) {
        E_INFO
            ("Affine warping takes up to two arguments, %s ignored.\n",
             tok);
    }
    if (params[0] == 0) {
        is_neutral = YES;
        E_INFO
            ("Affine warping cannot have slope zero, warping not applied.\n");
    }
}